

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_replay.cpp
# Opt level: O0

bool __thiscall
ThreadedReplayer::enqueue_create_sampler
          (ThreadedReplayer *this,Hash index,VkSamplerCreateInfo *create_info,VkSampler *sampler)

{
  mapped_type pVVar1;
  bool bVar2;
  VkResult VVar3;
  PerThreadData *pPVar4;
  pointer pVVar5;
  FeatureFilter *this_00;
  mapped_type *ppVVar6;
  PerThreadData *per_thread;
  VkSampler *sampler_local;
  VkSamplerCreateInfo *create_info_local;
  Hash index_local;
  ThreadedReplayer *this_local;
  
  create_info_local = (VkSamplerCreateInfo *)index;
  index_local = (Hash)this;
  pPVar4 = get_per_thread_data(this);
  if (((pPVar4->expected_tag == RESOURCE_SAMPLER) ||
      (pPVar4->expected_tag == RESOURCE_DESCRIPTOR_SET_LAYOUT)) ||
     (pPVar4->expected_tag == RESOURCE_PIPELINE_LAYOUT)) {
    pVVar5 = std::unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>
             ::operator->(&this->device);
    this_00 = Fossilize::VulkanDevice::get_feature_filter(pVVar5);
    bVar2 = Fossilize::FeatureFilter::sampler_is_supported(this_00,create_info);
    if (bVar2) {
      pVVar5 = std::
               unique_ptr<Fossilize::VulkanDevice,_std::default_delete<Fossilize::VulkanDevice>_>::
               operator->(&this->device);
      VVar3 = Fossilize::VulkanDevice::create_sampler_with_ycbcr_remap(pVVar5,create_info,sampler);
      if (VVar3 == VK_SUCCESS) {
        pVVar1 = *sampler;
        ppVVar6 = std::
                  unordered_map<unsigned_long,_VkSampler_T_*,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_VkSampler_T_*>_>_>
                  ::operator[](&this->samplers,(key_type *)&create_info_local);
        *ppVVar6 = pVVar1;
        this_local._7_1_ = true;
      }
      else {
        fprintf(_stderr,"Fossilize ERROR: Creating sampler %016lx Failed!\n",create_info_local);
        fflush(_stderr);
        this_local._7_1_ = false;
      }
    }
    else {
      fprintf(_stderr,"Fossilize WARN: Sampler %016lx is not supported. Skipping.\n",
              create_info_local);
      fflush(_stderr);
      this_local._7_1_ = false;
    }
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool enqueue_create_sampler(Hash index, const VkSamplerCreateInfo *create_info, VkSampler *sampler) override
	{
		auto &per_thread = get_per_thread_data();
		if (per_thread.expected_tag != RESOURCE_SAMPLER &&
		    per_thread.expected_tag != RESOURCE_DESCRIPTOR_SET_LAYOUT &&
		    per_thread.expected_tag != RESOURCE_PIPELINE_LAYOUT)
		{
			return false;
		}

		if (!device->get_feature_filter().sampler_is_supported(create_info))
		{
			LOGW("Sampler %016" PRIx64 " is not supported. Skipping.\n", index);
			return false;
		}

		if (device->create_sampler_with_ycbcr_remap(create_info, sampler) != VK_SUCCESS)
		{
			LOGE("Creating sampler %016" PRIx64 " Failed!\n", index);
			return false;
		}

		samplers[index] = *sampler;
		return true;
	}